

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::cmMakefile
          (cmMakefile *this,cmGlobalGenerator *globalGenerator,cmStateSnapshot *snapshot)

{
  _Rb_tree_header *p_Var1;
  cmStateSnapshot *this_00;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar2;
  cmState *this_01;
  allocator<char> local_d1 [9];
  undefined1 local_c8 [32];
  _WordT local_a8;
  _WordT _Stack_a0;
  _WordT local_98;
  stack<int,_std::deque<int,_std::allocator<int>_>_> *local_60;
  vector<cmSourceGroup,std::allocator<cmSourceGroup>> *local_58;
  string *local_50;
  string *local_48;
  
  std::
  _Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::_Deque_base((_Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)this);
  p_Var1 = &(this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header;
  (this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->Targets)._M_h._M_buckets = &(this->Targets)._M_h._M_single_bucket;
  (this->Targets)._M_h._M_bucket_count = 1;
  (this->Targets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->Targets)._M_h._M_element_count = 0;
  (this->Targets)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->Targets)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->Targets)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->AliasTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->OrderedTargets).super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OrderedTargets).super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OrderedTargets).super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SourceFiles).
  super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SourceFiles).
  super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SourceFiles).
  super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SourceFileSearchIndex)._M_h._M_buckets =
       &(this->SourceFileSearchIndex)._M_h._M_single_bucket;
  (this->SourceFileSearchIndex)._M_h._M_bucket_count = 1;
  (this->SourceFileSearchIndex)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->SourceFileSearchIndex)._M_h._M_element_count = 0;
  (this->SourceFileSearchIndex)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->SourceFileSearchIndex)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->SourceFileSearchIndex)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->KnownFileSearchIndex)._M_h._M_buckets = &(this->KnownFileSearchIndex)._M_h._M_single_bucket
  ;
  (this->KnownFileSearchIndex)._M_h._M_bucket_count = 1;
  (this->KnownFileSearchIndex)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->KnownFileSearchIndex)._M_h._M_element_count = 0;
  (this->KnownFileSearchIndex)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->KnownFileSearchIndex)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->KnownFileSearchIndex)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->Tests)._M_t._M_impl.super__Rb_tree_header;
  (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->TestGenerators).
  super__Vector_base<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TestGenerators).
  super__Vector_base<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->InstallGenerators).
  super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->InstallGenerators).
  super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->OutputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->InstallGenerators).
  super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OutputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OutputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ListFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ListFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ListFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TestGenerators).
  super__Vector_base<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ComplainFileRegularExpression)._M_dataplus._M_p =
       (pointer)&(this->ComplainFileRegularExpression).field_2;
  (this->ComplainFileRegularExpression)._M_string_length = 0;
  (this->ComplainFileRegularExpression).field_2._M_local_buf[0] = '\0';
  (this->DefineFlags)._M_dataplus._M_p = (pointer)&(this->DefineFlags).field_2;
  (this->DefineFlags)._M_string_length = 0;
  local_48 = &this->ComplainFileRegularExpression;
  local_50 = &this->DefineFlags;
  (this->DefineFlags).field_2._M_local_buf[0] = '\0';
  (this->DefineFlagsOrig)._M_dataplus._M_p = (pointer)&(this->DefineFlagsOrig).field_2;
  (this->DefineFlagsOrig)._M_string_length = 0;
  (this->DefineFlagsOrig).field_2._M_local_buf[0] = '\0';
  (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = (vector<cmSourceGroup,std::allocator<cmSourceGroup>> *)&this->SourceGroups;
  (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->GlobalGenerator = globalGenerator;
  (this->StateSnapshot).Position.Position = (snapshot->Position).Position;
  pcVar2 = (snapshot->Position).Tree;
  (this->StateSnapshot).State = snapshot->State;
  (this->StateSnapshot).Position.Tree = pcVar2;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
            (&(this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
  (this->Defer)._M_t.
  super___uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmMakefile::DeferCommands_*,_std::default_delete<cmMakefile::DeferCommands>_>
  .super__Head_base<0UL,_cmMakefile::DeferCommands_*,_false>._M_head_impl = (DeferCommands *)0x0;
  this->DeferRunning = false;
  local_60 = &this->LoopBlockCounter;
  *(undefined8 *)&(this->ExecuteCommandCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->ExecuteCommandCallback).super__Function_base._M_functor + 8) = 0;
  (this->ExecuteCommandCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->ExecuteCommandCallback)._M_invoker = (_Invoker_type)0x0;
  (this->FunctionBlockers).c.
  super__Vector_base<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FunctionBlockers).c.
  super__Vector_base<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FunctionBlockers).c.
  super__Vector_base<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FunctionBlockerBarriers).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FunctionBlockerBarriers).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FunctionBlockerBarriers).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>(local_60);
  (this->cmDefineRegex).regmust = (char *)0x0;
  (this->cmDefineRegex).program = (char *)0x0;
  (this->cmDefineRegex).progsize = 0;
  memset(&this->cmDefineRegex,0,0xaa);
  (this->cmDefine01Regex).regmust = (char *)0x0;
  (this->cmDefine01Regex).program = (char *)0x0;
  (this->cmDefine01Regex).progsize = 0;
  memset(&this->cmDefine01Regex,0,0xaa);
  (this->cmAtVarRegex).regmust = (char *)0x0;
  (this->cmAtVarRegex).program = (char *)0x0;
  (this->cmAtVarRegex).progsize = 0;
  memset(&this->cmAtVarRegex,0,0xaa);
  (this->cmNamedCurly).regmust = (char *)0x0;
  (this->cmNamedCurly).program = (char *)0x0;
  (this->cmNamedCurly).progsize = 0;
  memset(&this->cmNamedCurly,0,0xaa);
  (this->UnConfiguredDirectories).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->UnConfiguredDirectories).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->UnConfiguredDirectories).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ExportBuildFileGenerators).
  super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ExportBuildFileGenerators).
  super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ExportBuildFileGenerators).
  super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->EvaluationFiles).
  super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->EvaluationFiles).
  super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->EvaluationFiles).
  super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ExecutionStatusStack).
  super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ExecutionStatusStack).
  super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ExecutionStatusStack).
  super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ImportedTargetsOwned).
  super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ImportedTargetsOwned).
  super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ImportedTargetsOwned).
  super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ImportedTargets)._M_h._M_buckets = &(this->ImportedTargets)._M_h._M_single_bucket;
  (this->ImportedTargets)._M_h._M_bucket_count = 1;
  (this->ImportedTargets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ImportedTargets)._M_h._M_element_count = 0;
  (this->ImportedTargets)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->WarnedCMP0074)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->WarnedCMP0074)._M_t._M_impl.super__Rb_tree_header;
  (this->WarnedCMP0074)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ImportedTargets)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ImportedTargets)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->GeneratorActions).
  super__Vector_base<BT<cmMakefile::GeneratorAction>,_std::allocator<BT<cmMakefile::GeneratorAction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->GeneratorActions).
  super__Vector_base<BT<cmMakefile::GeneratorAction>,_std::allocator<BT<cmMakefile::GeneratorAction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->GeneratorActions).
           super__Vector_base<BT<cmMakefile::GeneratorAction>,_std::allocator<BT<cmMakefile::GeneratorAction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->GeneratorActions).
           super__Vector_base<BT<cmMakefile::GeneratorAction>,_std::allocator<BT<cmMakefile::GeneratorAction>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  (this->WarnedCMP0074)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->WarnedCMP0074)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->WarnedCMP0074)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->CurrentImportedTargetScope = Local;
  this->IsSourceFileTryCompile = false;
  this->CheckSystemVars = this->GlobalGenerator->CMakeInstance->CheckSystemVars;
  this->SuppressSideEffects = false;
  std::__cxx11::string::assign((char *)local_48);
  std::__cxx11::string::assign((char *)local_50);
  cmsys::RegularExpression::compile
            (&this->cmDefineRegex,"#([ \t]*)cmakedefine[ \t]+([A-Za-z_0-9]*)");
  cmsys::RegularExpression::compile
            (&this->cmDefine01Regex,"#([ \t]*)cmakedefine01[ \t]+([A-Za-z_0-9]*)");
  cmsys::RegularExpression::compile(&this->cmAtVarRegex,"(@[A-Za-z_0-9/.+-]+@)");
  cmsys::RegularExpression::compile(&this->cmNamedCurly,"^[A-Za-z0-9/_.+-]+{");
  this_00 = &this->StateSnapshot;
  this_01 = cmStateSnapshot::GetState(this_00);
  cmState::CreatePolicyScopeSnapshot((cmStateSnapshot *)local_c8,this_01,this_00);
  (this->StateSnapshot).Position.Position = local_c8._16_8_;
  this_00->State = (cmState *)local_c8._0_8_;
  (this->StateSnapshot).Position.Tree =
       (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_c8._8_8_;
  this->RecursionDepth = 0;
  local_a8 = 0;
  _Stack_a0 = 0;
  local_c8._16_8_ = 0;
  local_c8._24_8_ = 0;
  local_c8._0_8_ = (cmState *)0x0;
  local_c8._8_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
  local_98 = 0;
  cmStateSnapshot::PushPolicy(this_00,(PolicyMap *)local_c8,false);
  PushLoopBlockBarrier(this);
  this->CheckCMP0000 = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_c8,"",local_d1);
  AddSourceGroup(this,(string *)local_c8,"^.*$");
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_c8,"Source Files",local_d1);
  AddSourceGroup(this,(string *)local_c8,
                 "\\.(C|F|M|c|c\\+\\+|cc|cpp|mpp|cxx|ixx|cppm|cu|f|f90|for|fpp|ftn|m|mm|rc|def|r|odl|idl|hpj|bat)$"
                );
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_c8,"Header Files",local_d1);
  AddSourceGroup(this,(string *)local_c8,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"Precompile Header File",local_d1);
  AddSourceGroup(this,(string *)local_c8,"cmake_pch(_[^.]+)?\\.(h|hxx)$");
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_c8,"CMake Rules",local_d1);
  AddSourceGroup(this,(string *)local_c8,"\\.rule$");
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_c8,"Resources",local_d1);
  AddSourceGroup(this,(string *)local_c8,"\\.(pdf|plist|png|jpeg|jpg|storyboard|xcassets)$");
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_c8,"Object Files",local_d1);
  AddSourceGroup(this,(string *)local_c8,"\\.(lo|o|obj)$");
  std::__cxx11::string::~string((string *)local_c8);
  this->ObjectLibrariesSourceGroupIndex =
       ((long)(this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>.
             _M_impl.super__Vector_impl_data._M_start) / 0x160;
  std::vector<cmSourceGroup,std::allocator<cmSourceGroup>>::
  emplace_back<char_const(&)[17],char_const(&)[19]>
            (local_58,(char (*) [17])"Object Libraries",(char (*) [19])"^MATCH_NO_SOURCES$");
  return;
}

Assistant:

cmMakefile::cmMakefile(cmGlobalGenerator* globalGenerator,
                       cmStateSnapshot const& snapshot)
  : GlobalGenerator(globalGenerator)
  , StateSnapshot(snapshot)
{
  this->IsSourceFileTryCompile = false;

  this->CheckSystemVars = this->GetCMakeInstance()->GetCheckSystemVars();

  this->SuppressSideEffects = false;

  // Setup the default include complaint regular expression (match nothing).
  this->ComplainFileRegularExpression = "^$";

  this->DefineFlags = " ";

  this->cmDefineRegex.compile("#([ \t]*)cmakedefine[ \t]+([A-Za-z_0-9]*)");
  this->cmDefine01Regex.compile("#([ \t]*)cmakedefine01[ \t]+([A-Za-z_0-9]*)");
  this->cmAtVarRegex.compile("(@[A-Za-z_0-9/.+-]+@)");
  this->cmNamedCurly.compile("^[A-Za-z0-9/_.+-]+{");

  this->StateSnapshot =
    this->StateSnapshot.GetState()->CreatePolicyScopeSnapshot(
      this->StateSnapshot);
  this->RecursionDepth = 0;

  // Enter a policy level for this directory.
  this->PushPolicy();

  // push empty loop block
  this->PushLoopBlockBarrier();

  // By default the check is not done.  It is enabled by
  // cmListFileCache in the top level if necessary.
  this->CheckCMP0000 = false;

#if !defined(CMAKE_BOOTSTRAP)
  this->AddSourceGroup("", "^.*$");
  this->AddSourceGroup("Source Files", CM_SOURCE_REGEX);
  this->AddSourceGroup("Header Files", CM_HEADER_REGEX);
  this->AddSourceGroup("Precompile Header File", CM_PCH_REGEX);
  this->AddSourceGroup("CMake Rules", "\\.rule$");
  this->AddSourceGroup("Resources", CM_RESOURCE_REGEX);
  this->AddSourceGroup("Object Files", "\\.(lo|o|obj)$");

  this->ObjectLibrariesSourceGroupIndex = this->SourceGroups.size();
  this->SourceGroups.emplace_back("Object Libraries", "^MATCH_NO_SOURCES$");
#endif
}